

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

void sb_bmp_mask_init(void)

{
  size_t len;
  size_t pos;
  size_t i;
  
  for (i = 0; i < 8; i = i + 1) {
    bmp_basic_mask[i] = (uint8_t)(1 << (7U - (char)i & 0x1f));
  }
  for (pos = 0; pos < 8; pos = pos + 1) {
    for (len = 0; len < 9; len = len + 1) {
      bmp_2d_mask[pos][len] = '\0';
      if ((len != 0) && (pos + len < 9)) {
        for (i = 0; i < len; i = i + 1) {
          bmp_2d_mask[pos][len] = bmp_2d_mask[pos][len] | bmp_basic_mask[pos + i];
        }
      }
    }
  }
  return;
}

Assistant:

void sb_bmp_mask_init()
{
    // preset masks to speed up bitmap set/clear operations
    size_t i, pos, len;
    for (i=0; i<8; ++i) {
        bmp_basic_mask[i] = 0x1 << (7-i);
    }
    for (pos=0; pos<8; ++pos) {
        for (len=0; len<9; ++len) {
            bmp_2d_mask[pos][len] = 0x0;
            if (len != 0 && pos+len <= 8) {
                for (i=0; i<len; ++i) {
                    bmp_2d_mask[pos][len] |= bmp_basic_mask[pos+i];
                }
            }
        }
    }
}